

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextEditState::OnKeyPressed(ImGuiTextEditState *this,int key)

{
  STB_TexteditState *state;
  int *piVar1;
  float fVar2;
  uchar uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  StbUndoRecord *pSVar13;
  bool bVar14;
  ImWchar IVar15;
  short sVar16;
  int iVar17;
  uint uVar18;
  StbFindState *pSVar19;
  ImWchar *pIVar20;
  long lVar21;
  ulong uVar22;
  short *psVar23;
  long lVar24;
  int new_text_len;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  float fVar29;
  StbFindState find;
  StbTexteditRow row;
  
  state = &this->StbState;
  uVar3 = (this->StbState).single_line;
LAB_00188aa3:
  switch(key) {
  case 0x10000:
    goto switchD_00188ab6_caseD_10000;
  case 0x10001:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      state->cursor = state->cursor + 1;
    }
    else {
      ImGuiStb::stb_textedit_move_to_last(this,state);
    }
    ImGuiStb::stb_textedit_clamp(this,state);
    goto LAB_001893bd;
  case 0x10002:
switchD_00188ab6_caseD_10002:
    if (uVar3 == '\0') {
      if ((key & 0x20000U) == 0) {
        if ((this->StbState).select_start != (this->StbState).select_end) {
          ImGuiStb::stb_textedit_move_to_first(state);
        }
      }
      else {
        ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      }
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_find_charpos
                (&find,this,(this->StbState).cursor,(uint)(this->StbState).single_line);
      if (find.prev_first == find.first_char) goto LAB_001893c1;
      pSVar19 = (StbFindState *)&(this->StbState).preferred_x;
      if ((this->StbState).has_preferred_x == '\0') {
        pSVar19 = &find;
      }
      fVar2 = pSVar19->x;
      (this->StbState).cursor = find.prev_first;
      ImGuiStb::STB_TEXTEDIT_LAYOUTROW(&row,this,find.prev_first);
      iVar17 = 0;
      if (row.num_chars < 1) {
        row.num_chars = 0;
        iVar17 = 0;
      }
      goto LAB_0018900a;
    }
    key = key & 0x20000U | 0x10000;
    goto LAB_00188aa3;
  case 0x10003:
switchD_00188ab6_caseD_10003:
    if (uVar3 != '\0') goto code_r0x00188af4;
    if ((key & 0x20000U) == 0) {
      if ((this->StbState).select_start != (this->StbState).select_end) {
        ImGuiStb::stb_textedit_move_to_last(this,state);
      }
    }
    else {
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
    }
    ImGuiStb::stb_textedit_clamp(this,state);
    ImGuiStb::stb_textedit_find_charpos
              (&find,this,(this->StbState).cursor,(uint)(this->StbState).single_line);
    if (find.length == 0) goto LAB_001893c1;
    pSVar19 = (StbFindState *)&(this->StbState).preferred_x;
    if ((this->StbState).has_preferred_x == '\0') {
      pSVar19 = &find;
    }
    fVar2 = pSVar19->x;
    iVar26 = find.length + find.first_char;
    (this->StbState).cursor = iVar26;
    ImGuiStb::STB_TEXTEDIT_LAYOUTROW(&row,this,iVar26);
    iVar17 = 0;
    if (row.num_chars < 1) {
      row.num_chars = 0;
      iVar17 = 0;
    }
    goto LAB_00188f4a;
  case 0x10004:
    ImGuiStb::stb_textedit_clamp(this,state);
    ImGuiStb::stb_textedit_move_to_first(state);
    if ((this->StbState).single_line == '\0') {
      iVar17 = state->cursor;
      while ((0 < iVar17 &&
             (IVar15 = ImGuiStb::STB_TEXTEDIT_GETCHAR(this,iVar17 + -1), IVar15 != 10))) {
        iVar17 = state->cursor + -1;
        state->cursor = iVar17;
      }
    }
    else {
      state->cursor = 0;
    }
    goto LAB_001893bd;
  case 0x10005:
    iVar17 = this->CurLenW;
    ImGuiStb::stb_textedit_clamp(this,state);
    ImGuiStb::stb_textedit_move_to_first(state);
    if ((this->StbState).single_line == '\0') {
      iVar26 = state->cursor;
      while ((iVar26 < iVar17 &&
             (IVar15 = ImGuiStb::STB_TEXTEDIT_GETCHAR(this,iVar26), IVar15 != 10))) {
        iVar26 = state->cursor + 1;
        state->cursor = iVar26;
      }
    }
    else {
      state->cursor = iVar17;
    }
    goto LAB_001893bd;
  case 0x10006:
    (this->StbState).select_end = 0;
    (this->StbState).cursor = 0;
    (this->StbState).select_start = 0;
    goto LAB_001893bd;
  case 0x10007:
    (this->StbState).cursor = this->CurLenW;
    (this->StbState).select_start = 0;
    (this->StbState).select_end = 0;
    goto LAB_001893bd;
  case 0x10008:
switchD_00188ab6_caseD_10008:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar17 = (this->StbState).cursor;
      if (iVar17 < this->CurLenW) {
        ImGuiStb::stb_textedit_delete(this,state,iVar17,1);
      }
      goto LAB_001893bd;
    }
    break;
  case 0x10009:
switchD_00188ab6_caseD_10009:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar17 = (this->StbState).cursor;
      if (0 < iVar17) {
        ImGuiStb::stb_textedit_delete(this,state,iVar17 + -1,1);
        (this->StbState).cursor = (this->StbState).cursor + -1;
      }
      goto LAB_001893bd;
    }
    break;
  case 0x1000a:
    lVar21 = (long)(this->StbState).undostate.undo_point;
    if (lVar21 == 0) goto LAB_001893bd;
    iVar17 = (this->StbState).undostate.undo_rec[lVar21 + -1].where;
    sVar4 = (this->StbState).undostate.undo_rec[lVar21 + -1].insert_length;
    new_text_len = (int)sVar4;
    sVar5 = (this->StbState).undostate.undo_rec[lVar21 + -1].delete_length;
    iVar26 = (int)sVar5;
    sVar6 = (this->StbState).undostate.undo_rec[lVar21 + -1].char_storage;
    uVar22 = (ulong)(this->StbState).undostate.redo_point;
    (this->StbState).undostate.undo_rec[uVar22 - 1].char_storage = -1;
    (this->StbState).undostate.undo_rec[uVar22 - 1].insert_length = sVar5;
    (this->StbState).undostate.undo_rec[uVar22 - 1].delete_length = sVar4;
    (this->StbState).undostate.undo_rec[uVar22 - 1].where = iVar17;
    if (sVar5 == 0) goto LAB_00189352;
    if ((this->StbState).undostate.undo_char_point + iVar26 < 999) goto LAB_0018925d;
    (this->StbState).undostate.undo_rec[uVar22 - 1].insert_length = 0;
    goto LAB_00189347;
  case 0x1000b:
    lVar21 = (long)(this->StbState).undostate.redo_point;
    if (lVar21 != 99) {
      sVar4 = (this->StbState).undostate.undo_point;
      iVar17 = (this->StbState).undostate.undo_rec[lVar21].where;
      sVar5 = (this->StbState).undostate.undo_rec[lVar21].insert_length;
      iVar26 = (int)sVar5;
      sVar6 = (this->StbState).undostate.undo_rec[lVar21].delete_length;
      uVar27 = (uint)sVar6;
      sVar7 = (this->StbState).undostate.undo_rec[lVar21].char_storage;
      (this->StbState).undostate.undo_rec[sVar4].char_storage = -1;
      (this->StbState).undostate.undo_rec[sVar4].delete_length = sVar5;
      (this->StbState).undostate.undo_rec[sVar4].insert_length = sVar6;
      (this->StbState).undostate.undo_rec[sVar4].where = iVar17;
      if (sVar6 != 0) {
        sVar8 = (this->StbState).undostate.undo_char_point;
        if ((int)(this->StbState).undostate.redo_char_point < (int)((int)sVar8 + uVar27)) {
          pSVar13 = (this->StbState).undostate.undo_rec + sVar4;
          pSVar13->insert_length = 0;
          pSVar13->delete_length = 0;
        }
        else {
          (this->StbState).undostate.undo_rec[sVar4].char_storage = sVar8;
          (this->StbState).undostate.undo_char_point = sVar8 + sVar6;
          uVar18 = uVar27;
          for (lVar21 = 0; (int)lVar21 < (int)(short)uVar18; lVar21 = lVar21 + 1) {
            IVar15 = ImGuiStb::STB_TEXTEDIT_GETCHAR
                               (this,(this->StbState).undostate.undo_rec[sVar4].where + (int)lVar21)
            ;
            (this->StbState).undostate.undo_char
            [(this->StbState).undostate.undo_rec[sVar4].char_storage + lVar21] = IVar15;
            uVar18 = (uint)(ushort)(this->StbState).undostate.undo_rec[sVar4].insert_length;
          }
        }
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar17,uVar27);
      }
      if (sVar5 == 0) {
        iVar26 = 0;
      }
      else {
        ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                  (this,iVar17,(this->StbState).undostate.undo_char + sVar7,iVar26);
        psVar23 = &(this->StbState).undostate.redo_char_point;
        *psVar23 = *psVar23 + sVar5;
      }
      (this->StbState).cursor = iVar26 + iVar17;
      uVar10 = (this->StbState).undostate.undo_point;
      uVar12 = (this->StbState).undostate.redo_point;
      (this->StbState).undostate.undo_point = uVar10 + 1;
      (this->StbState).undostate.redo_point = uVar12 + 1;
    }
    goto LAB_001893bd;
  case 0x1000c:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar17 = ImGuiStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->StbState).cursor);
      goto LAB_00188d10;
    }
    ImGuiStb::stb_textedit_move_to_first(state);
    goto LAB_001893c1;
  case 0x1000d:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar17 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor);
LAB_00188d10:
      (this->StbState).cursor = iVar17;
LAB_00188d13:
      ImGuiStb::stb_textedit_clamp(this,state);
    }
    else {
      ImGuiStb::stb_textedit_move_to_last(this,state);
    }
    goto LAB_001893c1;
  default:
    switch(key) {
    case 0x30000:
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      iVar17 = (this->StbState).select_end;
      if (0 < iVar17) {
        iVar17 = iVar17 + -1;
        goto LAB_00188c3d;
      }
      break;
    case 0x30001:
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      piVar1 = &(this->StbState).select_end;
      *piVar1 = *piVar1 + 1;
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar17 = (this->StbState).select_end;
      break;
    case 0x30002:
      goto switchD_00188ab6_caseD_10002;
    case 0x30003:
      goto switchD_00188ab6_caseD_10003;
    case 0x30004:
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->StbState).single_line == '\0') {
        iVar17 = state->cursor;
        goto LAB_00189161;
      }
      state->cursor = 0;
      iVar17 = 0;
      goto LAB_00188bd4;
    case 0x30005:
      iVar17 = this->CurLenW;
      ImGuiStb::stb_textedit_clamp(this,state);
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      if ((this->StbState).single_line == '\0') {
        iVar26 = state->cursor;
        goto LAB_0018918a;
      }
      state->cursor = iVar17;
      iVar26 = iVar17;
      goto LAB_001891a8;
    case 0x30006:
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      (this->StbState).select_end = 0;
      (this->StbState).cursor = 0;
      goto LAB_001893bd;
    case 0x30007:
      ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      iVar17 = this->CurLenW;
LAB_00188c3d:
      (this->StbState).select_end = iVar17;
      break;
    case 0x30008:
      goto switchD_00188ab6_caseD_10008;
    case 0x30009:
      goto switchD_00188ab6_caseD_10009;
    default:
      uVar27 = 0;
      if (key < 0x10000) {
        uVar27 = key;
      }
      if (((int)uVar27 < 1) || (find.x._0_2_ = (undefined2)uVar27, uVar27 == 10 && uVar3 != '\0'))
      goto LAB_001893c1;
      if (((this->StbState).insert_mode == '\0') ||
         (((this->StbState).select_start != (this->StbState).select_end ||
          (iVar17 = (this->StbState).cursor, this->CurLenW <= iVar17)))) {
        ImGuiStb::stb_textedit_delete_selection(this,state);
        bVar14 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,(ImWchar *)&find,1)
        ;
        if (!bVar14) goto LAB_001893c1;
        ImGuiStb::stb_text_makeundo_insert(state,state->cursor,1);
      }
      else {
        pIVar20 = ImGuiStb::stb_text_createundo(&(this->StbState).undostate,iVar17,1,1);
        if (pIVar20 != (ImWchar *)0x0) {
          IVar15 = ImGuiStb::STB_TEXTEDIT_GETCHAR(this,iVar17);
          *pIVar20 = IVar15;
        }
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
        bVar14 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,(ImWchar *)&find,1)
        ;
        if (!bVar14) goto LAB_001893c1;
      }
      (this->StbState).cursor = (this->StbState).cursor + 1;
      goto LAB_001893bd;
    case 0x3000c:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar17 = ImGuiStb::STB_TEXTEDIT_MOVEWORDLEFT_IMPL(this,(this->StbState).cursor);
      goto LAB_00188c78;
    case 0x3000d:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        ImGuiStb::stb_textedit_prep_selection_at_cursor(state);
      }
      iVar17 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor);
LAB_00188c78:
      (this->StbState).cursor = iVar17;
      (this->StbState).select_end = iVar17;
      goto LAB_00188d13;
    }
    (this->StbState).cursor = iVar17;
    goto LAB_001893bd;
  }
  ImGuiStb::stb_textedit_delete_selection(this,state);
  goto LAB_001893bd;
LAB_0018918a:
  if (iVar17 <= iVar26) goto LAB_001891a8;
  IVar15 = ImGuiStb::STB_TEXTEDIT_GETCHAR(this,iVar26);
  iVar26 = (this->StbState).cursor;
  if (IVar15 == 10) goto LAB_001891a8;
  iVar26 = iVar26 + 1;
  state->cursor = iVar26;
  goto LAB_0018918a;
LAB_001891a8:
  (this->StbState).select_end = iVar26;
  goto LAB_001893bd;
LAB_00189161:
  if (iVar17 < 1) goto LAB_00188bd4;
  IVar15 = ImGuiStb::STB_TEXTEDIT_GETCHAR(this,iVar17 + -1);
  iVar17 = (this->StbState).cursor;
  if (IVar15 == 10) goto LAB_00188bd4;
  iVar17 = iVar17 + -1;
  state->cursor = iVar17;
  goto LAB_00189161;
LAB_00188bd4:
  (this->StbState).select_end = iVar17;
  goto LAB_001893bd;
LAB_0018925d:
  iVar25 = (this->StbState).undostate.undo_char_point + iVar26;
  sVar7 = (this->StbState).undostate.redo_char_point;
  lVar21 = (long)(short)uVar22;
  if (sVar7 < iVar25) goto code_r0x0018927d;
  psVar23 = &(this->StbState).undostate.undo_rec[lVar21 + -1].char_storage;
  *psVar23 = sVar7 - sVar5;
  (this->StbState).undostate.redo_char_point = sVar7 - sVar5;
  lVar21 = 0;
  iVar28 = 0;
  if (0 < iVar26) {
    iVar28 = iVar26;
  }
  for (; iVar28 != (int)lVar21; lVar21 = lVar21 + 1) {
    IVar15 = ImGuiStb::STB_TEXTEDIT_GETCHAR(this,iVar17 + (int)lVar21);
    (this->StbState).undostate.undo_char[*psVar23 + lVar21] = IVar15;
  }
LAB_00189331:
  if (iVar25 <= sVar7) {
LAB_00189347:
    ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar17,iVar26);
LAB_00189352:
    if (sVar4 == 0) {
      new_text_len = 0;
    }
    else {
      ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                (this,iVar17,(this->StbState).undostate.undo_char + sVar6,new_text_len);
      psVar23 = &(this->StbState).undostate.undo_char_point;
      *psVar23 = *psVar23 - sVar4;
    }
    (this->StbState).cursor = iVar17 + new_text_len;
    uVar9 = (this->StbState).undostate.undo_point;
    uVar11 = (this->StbState).undostate.redo_point;
    (this->StbState).undostate.undo_point = uVar9 + -1;
    (this->StbState).undostate.redo_point = uVar11 + -1;
  }
  goto LAB_001893bd;
code_r0x0018927d:
  if ((short)uVar22 < 99) {
    if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
      sVar8 = (this->StbState).undostate.undo_rec[0x62].insert_length;
      sVar16 = sVar8 + sVar7;
      (this->StbState).undostate.redo_char_point = sVar16;
      pIVar20 = (this->StbState).undostate.undo_char + sVar16;
      memmove(pIVar20,pIVar20 + -(long)sVar8,(long)sVar16 * -2 + 0x7ce);
      lVar21 = (long)(this->StbState).undostate.redo_point;
      psVar23 = &(this->StbState).undostate.undo_rec[lVar21].char_storage;
      for (lVar24 = lVar21; lVar24 < 0x62; lVar24 = lVar24 + 1) {
        if (-1 < *psVar23) {
          *psVar23 = *psVar23 + sVar8;
        }
        psVar23 = psVar23 + 6;
      }
    }
    memmove((this->StbState).undostate.undo_rec + lVar21,
            (this->StbState).undostate.undo_rec + lVar21 + -1,(99 - lVar21) * 0xc);
    uVar27 = *(int *)&(this->StbState).undostate.redo_point + 1;
    uVar22 = (ulong)uVar27;
    (this->StbState).undostate.redo_point = (short)uVar27;
  }
  if ((short)uVar22 == 99) goto LAB_00189331;
  goto LAB_0018925d;
code_r0x00188af4:
  key = key & 0x20000U | 0x10001;
  goto LAB_00188aa3;
LAB_00188f4a:
  if (row.num_chars == iVar17) goto LAB_00189044;
  fVar29 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,iVar26,iVar17);
  if (((fVar29 == -1.0) && (!NAN(fVar29))) || (row.x0 = row.x0 + fVar29, fVar2 < row.x0))
  goto LAB_00189044;
  state->cursor = state->cursor + 1;
  iVar17 = iVar17 + 1;
  goto LAB_00188f4a;
LAB_0018900a:
  if (row.num_chars == iVar17) goto LAB_00189044;
  fVar29 = ImGuiStb::STB_TEXTEDIT_GETWIDTH(this,find.prev_first,iVar17);
  if (((fVar29 == -1.0) && (!NAN(fVar29))) || (row.x0 = row.x0 + fVar29, fVar2 < row.x0))
  goto LAB_00189044;
  state->cursor = state->cursor + 1;
  iVar17 = iVar17 + 1;
  goto LAB_0018900a;
LAB_00189044:
  ImGuiStb::stb_textedit_clamp(this,state);
  (this->StbState).has_preferred_x = '\x01';
  (this->StbState).preferred_x = fVar2;
  if ((key & 0x20000U) != 0) {
    (this->StbState).select_end = (this->StbState).cursor;
  }
  goto LAB_001893c1;
switchD_00188ab6_caseD_10000:
  if ((this->StbState).select_start == (this->StbState).select_end) {
    if (0 < state->cursor) {
      state->cursor = state->cursor + -1;
    }
  }
  else {
    ImGuiStb::stb_textedit_move_to_first(state);
  }
LAB_001893bd:
  (this->StbState).has_preferred_x = '\0';
LAB_001893c1:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiTextEditState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}